

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O2

CURLcode smb_connection_state(Curl_easy *data,_Bool *done)

{
  uchar *plaintext;
  smb_conn_state sVar1;
  uint uVar2;
  connectdata *conn;
  connectdata *pcVar3;
  long lVar4;
  _Bool _Var5;
  CURLcode CVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  void *msg;
  long local_4d8;
  ulong local_4d0;
  uchar lm [24];
  uchar nt_hash [21];
  uchar lm_hash [21];
  undefined4 local_468;
  undefined4 uStack_464;
  undefined4 uStack_460;
  undefined4 uStack_45c;
  undefined8 local_458;
  _Bool ssl_done;
  undefined3 local_44b;
  undefined4 uStack_448;
  undefined1 uStack_444;
  undefined1 uStack_443;
  undefined2 uStack_442;
  undefined2 uStack_440;
  undefined4 uStack_43e;
  undefined2 uStack_43a;
  undefined8 uStack_438;
  uchar local_430 [8];
  uchar auStack_428 [8];
  uchar local_420 [8];
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined8 local_408;
  char local_400 [976];
  
  conn = data->conn;
  msg = (void *)0x0;
  if ((conn->proto).smbc.state == SMB_CONNECTING) {
    _Var5 = Curl_conn_is_ssl(conn,0);
    if (_Var5) {
      _ssl_done = _ssl_done & 0xff00;
      CVar6 = Curl_conn_connect(data,0,false,&ssl_done);
      if ((CVar6 != CURLE_OK) && (CVar6 != CURLE_AGAIN)) {
        return CVar6;
      }
      if (ssl_done != true) {
        return CURLE_OK;
      }
    }
    CVar6 = smb_send_message(data,'r',"",0xf);
    if (CVar6 != CURLE_OK) goto LAB_00151f39;
    (data->conn->proto).smbc.state = SMB_NEGOTIATE;
  }
  CVar6 = smb_send_and_recv(data,&msg);
  if ((CVar6 != CURLE_OK) && (CVar6 != CURLE_AGAIN)) {
LAB_00151f39:
    Curl_conncontrol(conn,1);
    return CVar6;
  }
  if (msg == (void *)0x0) {
    return CURLE_OK;
  }
  sVar1 = (conn->proto).smbc.state;
  if (sVar1 == SMB_SETUP) {
    if (*(int *)((long)msg + 9) != 0) {
      Curl_conncontrol(conn,1);
      return CURLE_LOGIN_DENIED;
    }
    (conn->proto).smbc.uid = *(unsigned_short *)((long)msg + 0x20);
    (data->conn->proto).smbc.state = SMB_CONNECTED;
    *done = true;
  }
  else if (sVar1 == SMB_NEGOTIATE) {
    if (((conn->proto).ftpc.pp.recvbuf.bufr < (char *)0x51) || (*(int *)((long)msg + 9) != 0)) {
      Curl_conncontrol(conn,1);
      return CURLE_COULDNT_CONNECT;
    }
    (conn->proto).ftpc.pp.response.tv_sec = *(time_t *)((long)msg + 0x49);
    (conn->proto).smbc.session_key = *(uint *)((long)msg + 0x34);
    pcVar3 = data->conn;
    sVar7 = strlen((char *)(pcVar3->proto).rtspc.buf.leng);
    sVar8 = strlen((char *)(pcVar3->proto).rtspc.buf.allc);
    uVar9 = sVar7 + sVar8 + 0x3d;
    if (uVar9 < 0x401) {
      local_4d8 = sVar8 + sVar7 + 0x30;
      local_4d0 = uVar9;
      Curl_ntlm_core_mk_lm_hash(pcVar3->passwd,lm_hash);
      plaintext = (pcVar3->proto).smbc.challenge;
      Curl_ntlm_core_lm_resp(lm_hash,plaintext,lm);
      Curl_ntlm_core_mk_nt_hash(pcVar3->passwd,nt_hash);
      Curl_ntlm_core_lm_resp(nt_hash,plaintext,(uchar *)&local_468);
      lVar4 = local_4d8;
      local_44b = 0;
      uStack_43a = 0;
      _ssl_done = 0xff0d;
      uStack_448 = 0x19000;
      uStack_444 = 1;
      uStack_443 = 0;
      uVar2 = (pcVar3->proto).smbc.session_key;
      uStack_442 = (undefined2)uVar2;
      uStack_440 = (undefined2)(uVar2 >> 0x10);
      uStack_438 = 0x80000;
      uStack_43e = 0x180018;
      local_430[0] = lm[0];
      local_430[1] = lm[1];
      local_430[2] = lm[2];
      local_430[3] = lm[3];
      local_430[4] = lm[4];
      local_430[5] = lm[5];
      local_430[6] = lm[6];
      local_430[7] = lm[7];
      auStack_428[0] = lm[8];
      auStack_428[1] = lm[9];
      auStack_428[2] = lm[10];
      auStack_428[3] = lm[0xb];
      auStack_428[4] = lm[0xc];
      auStack_428[5] = lm[0xd];
      auStack_428[6] = lm[0xe];
      auStack_428[7] = lm[0xf];
      local_420[0] = lm[0x10];
      local_420[1] = lm[0x11];
      local_420[2] = lm[0x12];
      local_420[3] = lm[0x13];
      local_420[4] = lm[0x14];
      local_420[5] = lm[0x15];
      local_420[6] = lm[0x16];
      local_420[7] = lm[0x17];
      local_418 = local_468;
      uStack_414 = uStack_464;
      uStack_410 = uStack_460;
      uStack_40c = uStack_45c;
      local_408 = local_458;
      curl_msnprintf(local_400,local_4d8 - 0x23,"%s%c%s%c%s%c%s",(pcVar3->proto).ftpc.pp.sendthis,0,
                     (pcVar3->proto).ftpc.pp.sendleft,0,"Linux",0,"curl");
      uStack_438 = CONCAT26((short)local_4d0,(undefined6)uStack_438);
      CVar6 = smb_send_message(data,'s',&ssl_done,lVar4 + 0x2a);
      if (CVar6 == CURLE_OK) {
        (data->conn->proto).smbc.state = SMB_SETUP;
        goto LAB_00151f7d;
      }
    }
    else {
      CVar6 = CURLE_FILESIZE_EXCEEDED;
    }
    Curl_conncontrol(conn,1);
    return CVar6;
  }
LAB_00151f7d:
  (conn->proto).ftpc.pp.recvbuf.bufr = (char *)0x0;
  return CURLE_OK;
}

Assistant:

static CURLcode smb_connection_state(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  struct smb_negotiate_response *nrsp;
  struct smb_header *h;
  CURLcode result;
  void *msg = NULL;

  if(smbc->state == SMB_CONNECTING) {
#ifdef USE_SSL
    if(Curl_conn_is_ssl(conn, FIRSTSOCKET)) {
      bool ssl_done = FALSE;
      result = Curl_conn_connect(data, FIRSTSOCKET, FALSE, &ssl_done);
      if(result && result != CURLE_AGAIN)
        return result;
      if(!ssl_done)
        return CURLE_OK;
    }
#endif

    result = smb_send_negotiate(data);
    if(result) {
      connclose(conn, "SMB: failed to send negotiate message");
      return result;
    }

    conn_state(data, SMB_NEGOTIATE);
  }

  /* Send the previous message and check for a response */
  result = smb_send_and_recv(data, &msg);
  if(result && result != CURLE_AGAIN) {
    connclose(conn, "SMB: failed to communicate");
    return result;
  }

  if(!msg)
    return CURLE_OK;

  h = msg;

  switch(smbc->state) {
  case SMB_NEGOTIATE:
    if((smbc->got < sizeof(*nrsp) + sizeof(smbc->challenge) - 1) ||
       h->status) {
      connclose(conn, "SMB: negotiation failed");
      return CURLE_COULDNT_CONNECT;
    }
    nrsp = msg;
#if defined(__GNUC__) && __GNUC__ >= 13
#pragma GCC diagnostic push
/* error: 'memcpy' offset [74, 80] from the object at '<unknown>' is out of
   the bounds of referenced subobject 'bytes' with type 'char[1]' */
#pragma GCC diagnostic ignored "-Warray-bounds"
#endif
    memcpy(smbc->challenge, nrsp->bytes, sizeof(smbc->challenge));
#if defined(__GNUC__) && __GNUC__ >= 13
#pragma GCC diagnostic pop
#endif
    smbc->session_key = smb_swap32(nrsp->session_key);
    result = smb_send_setup(data);
    if(result) {
      connclose(conn, "SMB: failed to send setup message");
      return result;
    }
    conn_state(data, SMB_SETUP);
    break;

  case SMB_SETUP:
    if(h->status) {
      connclose(conn, "SMB: authentication failed");
      return CURLE_LOGIN_DENIED;
    }
    smbc->uid = smb_swap16(h->uid);
    conn_state(data, SMB_CONNECTED);
    *done = TRUE;
    break;

  default:
    smb_pop_message(conn);
    return CURLE_OK; /* ignore */
  }

  smb_pop_message(conn);

  return CURLE_OK;
}